

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

HttpAuthDetails * http_auth_details_new(void)

{
  HttpAuthDetails *__s;
  strbuf *psVar1;
  HttpAuthDetails *d;
  
  __s = (HttpAuthDetails *)safemalloc(1,0x38,0);
  memset(__s,0,0x38);
  psVar1 = strbuf_new();
  __s->realm = psVar1;
  psVar1 = strbuf_new();
  __s->nonce = psVar1;
  psVar1 = strbuf_new();
  __s->opaque = psVar1;
  psVar1 = strbuf_new();
  __s->error = psVar1;
  return __s;
}

Assistant:

static HttpAuthDetails *http_auth_details_new(void)
{
    HttpAuthDetails *d = snew(HttpAuthDetails);
    memset(d, 0, sizeof(*d));
    d->realm = strbuf_new();
    d->nonce = strbuf_new();
    d->opaque = strbuf_new();
    d->error = strbuf_new();
    return d;
}